

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tracker_manager.cpp
# Opt level: O1

void __thiscall
libtorrent::aux::tracker_connection::tracker_connection
          (tracker_connection *this,tracker_manager *man,tracker_request *req,io_context *ios,
          weak_ptr<libtorrent::aux::request_callback> *r)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  undefined8 uVar5;
  int64_t iVar6;
  int64_t iVar7;
  int64_t iVar8;
  int64_t iVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  context *pcVar12;
  uint16_t uVar13;
  event_t eVar14;
  tracker_request_flags_t tVar15;
  uint32_t uVar16;
  bool bVar17;
  undefined6 uVar18;
  
  timeout_handler::timeout_handler(&this->super_timeout_handler,ios);
  (this->super_timeout_handler)._vptr_timeout_handler =
       (_func_int **)&PTR___cxa_pure_virtual_004f0888;
  paVar1 = &(this->m_req).url.field_2;
  (this->m_req).url._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (req->url)._M_dataplus._M_p;
  paVar2 = &(req->url).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar5 = *(undefined8 *)((long)&(req->url).field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->m_req).url.field_2 + 8) = uVar5;
  }
  else {
    (this->m_req).url._M_dataplus._M_p = pcVar3;
    (this->m_req).url.field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->m_req).url._M_string_length = (req->url)._M_string_length;
  (req->url)._M_dataplus._M_p = (pointer)paVar2;
  (req->url)._M_string_length = 0;
  (req->url).field_2._M_local_buf[0] = '\0';
  paVar1 = &(this->m_req).trackerid.field_2;
  (this->m_req).trackerid._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (req->trackerid)._M_dataplus._M_p;
  paVar2 = &(req->trackerid).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar5 = *(undefined8 *)((long)&(req->trackerid).field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->m_req).trackerid.field_2 + 8) = uVar5;
  }
  else {
    (this->m_req).trackerid._M_dataplus._M_p = pcVar3;
    (this->m_req).trackerid.field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->m_req).trackerid._M_string_length = (req->trackerid)._M_string_length;
  (req->trackerid)._M_dataplus._M_p = (pointer)paVar2;
  (req->trackerid)._M_string_length = 0;
  (req->trackerid).field_2._M_local_buf[0] = '\0';
  (this->m_req).filter.super___shared_ptr<const_libtorrent::ip_filter,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (req->filter).super___shared_ptr<const_libtorrent::ip_filter,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  (this->m_req).filter.super___shared_ptr<const_libtorrent::ip_filter,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var4 = (req->filter).super___shared_ptr<const_libtorrent::ip_filter,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
  (req->filter).super___shared_ptr<const_libtorrent::ip_filter,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->m_req).filter.super___shared_ptr<const_libtorrent::ip_filter,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var4;
  (req->filter).super___shared_ptr<const_libtorrent::ip_filter,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->m_req).num_want = req->num_want;
  iVar6 = req->downloaded;
  iVar7 = req->uploaded;
  iVar8 = req->left;
  iVar9 = req->corrupt;
  uVar13 = req->listen_port;
  eVar14 = req->event;
  tVar15.m_val = (req->kind).m_val;
  uVar16 = req->key;
  (this->m_req).redundant = req->redundant;
  (this->m_req).listen_port = uVar13;
  (this->m_req).event = eVar14;
  (this->m_req).kind = (tracker_request_flags_t)tVar15.m_val;
  (this->m_req).key = uVar16;
  (this->m_req).left = iVar8;
  (this->m_req).corrupt = iVar9;
  (this->m_req).downloaded = iVar6;
  (this->m_req).uploaded = iVar7;
  (this->m_req).ipv6.
  super__Vector_base<boost::asio::ip::address_v6,_std::allocator<boost::asio::ip::address_v6>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (req->ipv6).
       super__Vector_base<boost::asio::ip::address_v6,_std::allocator<boost::asio::ip::address_v6>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (this->m_req).ipv6.
  super__Vector_base<boost::asio::ip::address_v6,_std::allocator<boost::asio::ip::address_v6>_>.
  _M_impl.super__Vector_impl_data._M_finish =
       (req->ipv6).
       super__Vector_base<boost::asio::ip::address_v6,_std::allocator<boost::asio::ip::address_v6>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  (this->m_req).ipv6.
  super__Vector_base<boost::asio::ip::address_v6,_std::allocator<boost::asio::ip::address_v6>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       (req->ipv6).
       super__Vector_base<boost::asio::ip::address_v6,_std::allocator<boost::asio::ip::address_v6>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (req->ipv6).
  super__Vector_base<boost::asio::ip::address_v6,_std::allocator<boost::asio::ip::address_v6>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (req->ipv6).
  super__Vector_base<boost::asio::ip::address_v6,_std::allocator<boost::asio::ip::address_v6>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (req->ipv6).
  super__Vector_base<boost::asio::ip::address_v6,_std::allocator<boost::asio::ip::address_v6>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_req).ipv4.
  super__Vector_base<boost::asio::ip::address_v4,_std::allocator<boost::asio::ip::address_v4>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (req->ipv4).
       super__Vector_base<boost::asio::ip::address_v4,_std::allocator<boost::asio::ip::address_v4>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (this->m_req).ipv4.
  super__Vector_base<boost::asio::ip::address_v4,_std::allocator<boost::asio::ip::address_v4>_>.
  _M_impl.super__Vector_impl_data._M_finish =
       (req->ipv4).
       super__Vector_base<boost::asio::ip::address_v4,_std::allocator<boost::asio::ip::address_v4>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  (this->m_req).ipv4.
  super__Vector_base<boost::asio::ip::address_v4,_std::allocator<boost::asio::ip::address_v4>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       (req->ipv4).
       super__Vector_base<boost::asio::ip::address_v4,_std::allocator<boost::asio::ip::address_v4>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (req->ipv4).
  super__Vector_base<boost::asio::ip::address_v4,_std::allocator<boost::asio::ip::address_v4>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (req->ipv4).
  super__Vector_base<boost::asio::ip::address_v4,_std::allocator<boost::asio::ip::address_v4>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (req->ipv4).
  super__Vector_base<boost::asio::ip::address_v4,_std::allocator<boost::asio::ip::address_v4>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined8 *)((this->m_req).pid.m_number._M_elems + 3) =
       *(undefined8 *)((req->pid).m_number._M_elems + 3);
  uVar5 = *(undefined8 *)(req->info_hash).m_number._M_elems;
  uVar10 = *(undefined8 *)((req->info_hash).m_number._M_elems + 2);
  uVar11 = *(undefined8 *)((req->pid).m_number._M_elems + 1);
  *(undefined8 *)((this->m_req).info_hash.m_number._M_elems + 4) =
       *(undefined8 *)((req->info_hash).m_number._M_elems + 4);
  *(undefined8 *)((this->m_req).pid.m_number._M_elems + 1) = uVar11;
  *(undefined8 *)(this->m_req).info_hash.m_number._M_elems = uVar5;
  *(undefined8 *)((this->m_req).info_hash.m_number._M_elems + 2) = uVar10;
  (this->m_req).outgoing_socket.m_sock.
  super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (req->outgoing_socket).m_sock.
       super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (this->m_req).outgoing_socket.m_sock.
  super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (req->outgoing_socket).m_sock.
       super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
       _M_pi;
  (req->outgoing_socket).m_sock.
  super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (req->outgoing_socket).m_sock.
  super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->m_req).i2pconn = req->i2pconn;
  bVar17 = req->triggered_manually;
  uVar18 = *(undefined6 *)&req->field_0xf2;
  pcVar12 = req->ssl_ctx;
  (this->m_req).private_torrent = req->private_torrent;
  (this->m_req).triggered_manually = bVar17;
  *(undefined6 *)&(this->m_req).field_0xf2 = uVar18;
  (this->m_req).ssl_ctx = pcVar12;
  (this->m_requester).
  super___weak_ptr<libtorrent::aux::request_callback,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (r->super___weak_ptr<libtorrent::aux::request_callback,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  (this->m_requester).
  super___weak_ptr<libtorrent::aux::request_callback,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (r->super___weak_ptr<libtorrent::aux::request_callback,_(__gnu_cxx::_Lock_policy)2>).
         _M_refcount._M_pi;
  (r->super___weak_ptr<libtorrent::aux::request_callback,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
       (element_type *)0x0;
  (r->super___weak_ptr<libtorrent::aux::request_callback,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->m_man = man;
  return;
}

Assistant:

tracker_connection::tracker_connection(
		tracker_manager& man
		, tracker_request req
		, io_context& ios
		, std::weak_ptr<request_callback> r)
		: timeout_handler(ios)
		, m_req(std::move(req))
		, m_requester(std::move(r))
		, m_man(man)
	{}